

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlsearch.c
# Opt level: O0

int XMLSearch_node_matches(XMLNode *node,XMLSearch *search)

{
  int iVar1;
  int local_28;
  int local_24;
  int j;
  int i;
  XMLSearch *search_local;
  XMLNode *node_local;
  
  if (node == (XMLNode *)0x0) {
    node_local._4_4_ = 0;
  }
  else if (search == (XMLSearch *)0x0) {
    node_local._4_4_ = 1;
  }
  else if ((node->tag_type == TAG_FATHER) || (node->tag_type == TAG_SELF)) {
    if ((search->tag == (SXML_CHAR *)0x0) ||
       (iVar1 = (*regstrcmp_search)(node->tag,search->tag), iVar1 != 0)) {
      if ((search->text == (SXML_CHAR *)0x0) ||
         (iVar1 = (*regstrcmp_search)(node->text,search->text), iVar1 != 0)) {
        if (search->attributes != (XMLAttribute *)0x0) {
          for (local_24 = 0; local_24 < search->n_attributes; local_24 = local_24 + 1) {
            local_28 = 0;
            while ((local_28 < node->n_attributes &&
                   ((node->attributes[local_28].active == 0 ||
                    (iVar1 = _attribute_matches(node->attributes + local_28,
                                                search->attributes + local_24), iVar1 == 0))))) {
              local_28 = local_28 + 1;
            }
            if (node->n_attributes <= local_28) {
              return 0;
            }
          }
        }
        if (search->prev == (_XMLSearch *)0x0) {
          node_local._4_4_ = 1;
        }
        else {
          node_local._4_4_ = XMLSearch_node_matches(node->father,search->prev);
        }
      }
      else {
        node_local._4_4_ = 0;
      }
    }
    else {
      node_local._4_4_ = 0;
    }
  }
  else {
    node_local._4_4_ = 0;
  }
  return node_local._4_4_;
}

Assistant:

int XMLSearch_node_matches(const XMLNode* node, const XMLSearch* search)
{
	int i, j;

	if (node == NULL)
		return FALSE;

	if (search == NULL)
		return TRUE;

	/* No comments, prolog, or such type of nodes are tested */
	if (node->tag_type != TAG_FATHER && node->tag_type != TAG_SELF)
		return FALSE;

	/* Check tag */
	if (search->tag != NULL && !regstrcmp_search(node->tag, search->tag))
		return FALSE;

	/* Check text */
	if (search->text != NULL && !regstrcmp_search(node->text, search->text))
		return FALSE;

	/* Check attributes */
	if (search->attributes != NULL) {
		for (i = 0; i < search->n_attributes; i++) {
			for (j = 0; j < node->n_attributes; j++) {
				if (!node->attributes[j].active)
					continue;
				if (_attribute_matches(&node->attributes[j], &search->attributes[i]))
					break;
			}
			if (j >= node->n_attributes) /* All attributes where scanned without a successful match */
				return FALSE;
		}
	}

	/* 'node' matches 'search'. If there is a father search, its father must match it */
	if (search->prev != NULL)
		return XMLSearch_node_matches(node->father, search->prev);

	/* TODO: Should a node match if search has no more 'prev' search and node father is still below the initial search ?
	 Depends if XPath started with "//" (=> yes) or "/" (=> no).
	 if (search->prev == NULL && node->father != search->from) return FALSE; ? */
		
	return TRUE;
}